

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O1

void __thiscall Indexer::make_spill(Indexer *this,DatasetBuilder *builder)

{
  DatabaseSnapshot *pDVar1;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  pointer ppOVar2;
  logger *plVar3;
  bool bVar4;
  pointer ppOVar5;
  string_view_t fmt;
  string_view_t fmt_00;
  string_view_t fmt_01;
  string merged_name;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> candidates;
  string dataset_name;
  string local_158;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> local_138;
  DatasetBuilder *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  DatabaseName local_f8;
  string local_50;
  
  pDVar1 = this->snap;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_120 = builder;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"set","");
  DatabaseSnapshot::allocate_name(&local_f8,pDVar1,&local_158);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_f8.filename._M_dataplus._M_p,
             local_f8.filename._M_dataplus._M_p + local_f8.filename._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.filename._M_dataplus._M_p != &local_f8.filename.field_2) {
    operator_delete(local_f8.filename._M_dataplus._M_p,
                    local_f8.filename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.id._M_dataplus._M_p != &local_f8.id.field_2) {
    operator_delete(local_f8.id._M_dataplus._M_p,local_f8.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.type._M_dataplus._M_p != &local_f8.type.field_2) {
    operator_delete(local_f8.type._M_dataplus._M_p,local_f8.type.field_2._M_allocated_capacity + 1);
  }
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_f8.db_base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  plVar3 = spdlog::default_logger_raw();
  local_f8.db_base._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_f8.db_base._M_pathname._M_string_length = 0;
  local_f8.db_base._M_pathname.field_2._M_allocated_capacity = 0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt.size_ = 0xf;
  fmt.data_ = "New dataset: {}";
  spdlog::logger::log<std::__cxx11::string>(plVar3,loc,debug,fmt,&local_118);
  DatasetBuilder::save(local_120,&this->snap->db_base,&local_118);
  register_dataset(this,&local_118);
  bVar4 = false;
  do {
    created_dataset_ptrs
              ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)&local_f8,
               this);
    OnDiskDataset::get_compact_candidates
              (&local_138,
               (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)&local_f8);
    if (local_f8.db_base._M_pathname._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_f8.db_base._M_pathname._M_dataplus._M_p,
                      local_f8.db_base._M_pathname.field_2._M_allocated_capacity -
                      (long)local_f8.db_base._M_pathname._M_dataplus._M_p);
    }
    local_158._M_dataplus._M_p =
         (pointer)((long)local_138.
                         super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_138.
                         super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
    if (local_158._M_dataplus._M_p <
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x14) {
      plVar3 = spdlog::default_logger_raw();
      local_f8.db_base._M_pathname._M_dataplus._M_p = (pointer)0x0;
      local_f8.db_base._M_pathname._M_string_length = 0;
      local_f8.db_base._M_pathname.field_2._M_allocated_capacity = 0;
      loc_01.funcname = (char *)0x0;
      loc_01.filename = (char *)0x0;
      loc_01.line = 0;
      loc_01._12_4_ = 0;
      fmt_01.size_ = 0x18;
      fmt_01.data_ = "{} datasets, not merging";
      spdlog::logger::log<unsigned_long>(plVar3,loc_01,debug,fmt_01,(unsigned_long *)&local_158);
      bVar4 = true;
    }
    else {
      plVar3 = spdlog::default_logger_raw();
      local_f8.db_base._M_pathname._M_dataplus._M_p = (pointer)0x0;
      local_f8.db_base._M_pathname._M_string_length = 0;
      local_f8.db_base._M_pathname.field_2._M_allocated_capacity = 0;
      loc_00.funcname = (char *)0x0;
      loc_00.filename = (char *)0x0;
      loc_00.line = 0;
      loc_00._12_4_ = 0;
      fmt_00.size_ = 0x13;
      fmt_00.data_ = "Merging {} datasets";
      spdlog::logger::log<unsigned_long>(plVar3,loc_00,debug,fmt_00,(unsigned_long *)&local_158);
      pDVar1 = this->snap;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"set","");
      DatabaseSnapshot::allocate_name(&local_f8,pDVar1,&local_50);
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,local_f8.filename._M_dataplus._M_p,
                 local_f8.filename._M_dataplus._M_p + local_f8.filename._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.filename._M_dataplus._M_p != &local_f8.filename.field_2) {
        operator_delete(local_f8.filename._M_dataplus._M_p,
                        local_f8.filename.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.id._M_dataplus._M_p != &local_f8.id.field_2) {
        operator_delete(local_f8.id._M_dataplus._M_p,local_f8.id.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.type._M_dataplus._M_p != &local_f8.type.field_2) {
        operator_delete(local_f8.type._M_dataplus._M_p,
                        local_f8.type.field_2._M_allocated_capacity + 1);
      }
      std::experimental::filesystem::v1::__cxx11::path::~path(&local_f8.db_base);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      OnDiskDataset::merge(&this->snap->db_base,&local_158,&local_138,(TaskSpec *)0x0);
      ppOVar2 = local_138.
                super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppOVar5 = local_138.
                     super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppOVar5 != ppOVar2;
          ppOVar5 = ppOVar5 + 1) {
        remove_dataset(this,*ppOVar5);
      }
      register_dataset(this,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_138.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.
                      super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_138.
                            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.
                            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  } while (!bVar4);
  DatasetBuilder::clear(local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Indexer::make_spill(DatasetBuilder &builder) {
    auto dataset_name = snap->allocate_name().get_filename();
    spdlog::debug("New dataset: {}", dataset_name);
    builder.save(snap->db_base, dataset_name);
    register_dataset(dataset_name);
    bool stop = false;

    while (!stop) {
        std::vector<const OnDiskDataset *> candidates =
            OnDiskDataset::get_compact_candidates(created_dataset_ptrs());

        if (candidates.size() >= INDEXER_COMPACT_THRESHOLD) {
            spdlog::debug("Merging {} datasets", candidates.size());
            std::string merged_name = snap->allocate_name().get_filename();
            OnDiskDataset::merge(snap->db_base, merged_name, candidates,
                                 nullptr);
            for (const auto *ds : candidates) {
                remove_dataset(ds);
            }
            register_dataset(merged_name);
        } else {
            spdlog::debug("{} datasets, not merging", candidates.size());
            stop = true;
        }
    }

    builder.clear();
}